

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O0

unsigned_long duckdb::ParquetDecodeUtils::VarintDecode<unsigned_long,true>(ByteBuffer *buf)

{
  byte bVar1;
  runtime_error *this;
  uint8_t byte;
  uint8_t shift;
  unsigned_long result;
  ByteBuffer *in_stack_ffffffffffffffd0;
  byte local_11;
  ulong local_10;
  
  local_10 = 0;
  local_11 = 0;
  do {
    bVar1 = ByteBuffer::read<unsigned_char>(in_stack_ffffffffffffffd0);
    local_10 = (long)(int)(bVar1 & 0x7f) << (local_11 & 0x3f) | local_10;
    if ((bVar1 & 0x80) == 0) {
      return local_10;
    }
    local_11 = local_11 + 7;
  } while (local_11 < 0x41);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Varint-decoding found too large number");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static T VarintDecode(ByteBuffer &buf) {
		T result = 0;
		uint8_t shift = 0;
		while (true) {
			uint8_t byte;
			if (CHECKED) {
				byte = buf.read<uint8_t>();
			} else {
				byte = buf.unsafe_read<uint8_t>();
			}
			result |= T(byte & 127) << shift;
			if ((byte & 128) == 0) {
				break;
			}
			shift += 7;
			if (shift > sizeof(T) * 8) {
				throw std::runtime_error("Varint-decoding found too large number");
			}
		}
		return result;
	}